

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::_InternalParse
          (CustomModel_CustomModelParamValue *this,char *ptr,ParseContext *ctx)

{
  ValueUnion *pVVar1;
  InternalMetadata *this_00;
  byte bVar2;
  byte bVar3;
  internal *this_01;
  size_t size;
  bool bVar4;
  byte *pbVar5;
  string *psVar6;
  uint uVar7;
  uint32_t uVar8;
  undefined8 *puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar10;
  uint uVar11;
  int64_t iVar12;
  pair<const_char_*,_unsigned_long> pVar13;
  pair<const_char_*,_unsigned_int> pVar14;
  pair<const_char_*,_unsigned_long> pVar15;
  StringPiece str;
  byte *local_40;
  int64_t local_38;
  char *field_name;
  
  local_40 = (byte *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (bVar4) {
    return (char *)local_40;
  }
  pVVar1 = &this->value_;
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  do {
    bVar2 = *local_40;
    uVar11 = (uint)bVar2;
    pbVar5 = local_40 + 1;
    if ((char)bVar2 < '\0') {
      bVar3 = local_40[1];
      uVar11 = ((uint)bVar2 + (uint)bVar3 * 0x80) - 0x80;
      if ((char)bVar3 < '\0') {
        pVar14 = google::protobuf::internal::ReadTagFallback((char *)local_40,uVar11);
        uVar11 = pVar14.second;
        pbVar5 = (byte *)pVar14.first;
      }
      else {
        pbVar5 = local_40 + 2;
      }
    }
    local_40 = pbVar5;
    uVar7 = uVar11 >> 3;
    field_name = (char *)(ulong)uVar7;
    cVar10 = (char)uVar11;
    if (0x27 < uVar7) {
      if (uVar7 == 0x28) {
        if (cVar10 != '@') goto LAB_0031f254;
        bVar2 = *local_40;
        pVar13.second = (long)(char)bVar2;
        pVar13.first = (char *)(local_40 + 1);
        if ((long)(char)bVar2 < 0) {
          bVar3 = local_40[1];
          uVar8 = ((uint)bVar3 * 0x80 + (uint)bVar2) - 0x80;
          if ((char)bVar3 < '\0') {
            pVar13 = google::protobuf::internal::VarintParseSlow64((char *)local_40,uVar8);
          }
          else {
            pVar13.second._0_4_ = uVar8;
            pVar13.first = (char *)(local_40 + 2);
            pVar13.second._4_4_ = 0;
          }
        }
        local_40 = (byte *)pVar13.first;
        if (this->_oneof_case_[0] != 0x28) {
          clear_value(this);
          this->_oneof_case_[0] = 0x28;
        }
        pVVar1->longvalue_ = pVar13.second;
      }
      else if (uVar7 == 0x32) {
        if (cVar10 != -0x70) goto LAB_0031f254;
        bVar2 = *local_40;
        pVar15.second = (long)(char)bVar2;
        pVar15.first = (char *)(local_40 + 1);
        if ((long)(char)bVar2 < 0) {
          bVar3 = local_40[1];
          uVar8 = ((uint)bVar3 * 0x80 + (uint)bVar2) - 0x80;
          if ((char)bVar3 < '\0') {
            pVar15 = google::protobuf::internal::VarintParseSlow64((char *)local_40,uVar8);
          }
          else {
            pVar15.second._0_4_ = uVar8;
            pVar15.first = (char *)(local_40 + 2);
            pVar15.second._4_4_ = 0;
          }
        }
        local_40 = (byte *)pVar15.first;
        if (this->_oneof_case_[0] != 0x32) {
          clear_value(this);
          this->_oneof_case_[0] = 0x32;
        }
        pVVar1->boolvalue_ = pVar15.second != 0;
      }
      else {
        if ((uVar7 != 0x3c) || (cVar10 != -0x1e)) goto LAB_0031f254;
        if (this->_oneof_case_[0] != 0x3c) {
          clear_value(this);
          this->_oneof_case_[0] = 0x3c;
          (this->value_).doublevalue_ =
               (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
        }
        puVar9 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
        if ((this_00->ptr_ & 1U) != 0) {
          puVar9 = (undefined8 *)*puVar9;
        }
        psVar6 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                           ((ArenaStringPtr *)pVVar1,puVar9);
        local_40 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (psVar6,(char *)local_40,ctx);
      }
      goto joined_r0x0031f20a;
    }
    if (uVar7 == 10) {
      if (cVar10 != 'Q') goto LAB_0031f254;
      iVar12 = *(int64_t *)local_40;
      if (this->_oneof_case_[0] != 10) {
        local_38 = *(int64_t *)local_40;
        clear_value(this);
        this->_oneof_case_[0] = 10;
        iVar12 = local_38;
      }
      pVVar1->longvalue_ = iVar12;
      local_40 = local_40 + 8;
    }
    else {
      if (uVar7 == 0x14) {
        if (cVar10 != -0x5e) goto LAB_0031f254;
        if (this->_oneof_case_[0] != 0x14) {
          clear_value(this);
          this->_oneof_case_[0] = 0x14;
          (this->value_).doublevalue_ =
               (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
        }
        puVar9 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
        if ((this_00->ptr_ & 1U) != 0) {
          puVar9 = (undefined8 *)*puVar9;
        }
        psVar6 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                           ((ArenaStringPtr *)pVVar1,puVar9);
        local_40 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (psVar6,(char *)local_40,ctx);
        this_01 = (internal *)(psVar6->_M_dataplus)._M_p;
        size = psVar6->_M_string_length;
        if ((long)size < 0) {
          google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (size,"string length exceeds max size");
        }
        str.length_ = 0;
        str.ptr_ = (char *)size;
        bVar4 = google::protobuf::internal::VerifyUTF8(this_01,str,field_name);
        if (!bVar4) {
          return (char *)0x0;
        }
      }
      else if ((uVar7 == 0x1e) && (cVar10 == -0x10)) {
        bVar2 = *local_40;
        uVar11 = (uint)bVar2;
        pbVar5 = local_40 + 1;
        if ((char)bVar2 < '\0') {
          uVar11 = ((uint)bVar2 + (uint)*pbVar5 * 0x80) - 0x80;
          if ((char)*pbVar5 < '\0') {
            pVar14 = google::protobuf::internal::VarintParseSlow32((char *)local_40,uVar11);
            pbVar5 = (byte *)pVar14.first;
            uVar11 = pVar14.second;
          }
          else {
            pbVar5 = local_40 + 2;
          }
        }
        local_40 = pbVar5;
        if (this->_oneof_case_[0] != 0x1e) {
          clear_value(this);
          this->_oneof_case_[0] = 0x1e;
        }
        *(uint *)pVVar1 = uVar11;
      }
      else {
LAB_0031f254:
        if ((uVar11 == 0) || ((uVar11 & 7) == 4)) {
          if (local_40 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar11 - 1;
          return (char *)local_40;
        }
        if ((this_00->ptr_ & 1U) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_40 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (uVar11,unknown,(char *)local_40,ctx);
      }
joined_r0x0031f20a:
      if (local_40 == (byte *)0x0) {
        return (char *)0x0;
      }
    }
    bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    if (bVar4) {
      return (char *)local_40;
    }
  } while( true );
}

Assistant:

const char* CustomModel_CustomModelParamValue::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // double doubleValue = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 81)) {
          _internal_set_doublevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // string stringValue = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_stringvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 intValue = 30;
      case 30:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 240)) {
          _internal_set_intvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int64 longValue = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 64)) {
          _internal_set_longvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool boolValue = 50;
      case 50:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 144)) {
          _internal_set_boolvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bytes bytesValue = 60;
      case 60:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 226)) {
          auto str = _internal_mutable_bytesvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}